

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeferForeignKey(Parse *pParse,int isDeferred)

{
  FKey *pFVar1;
  FKey *pFKey;
  Table *pTab;
  int isDeferred_local;
  Parse *pParse_local;
  
  if ((pParse->pNewTable != (Table *)0x0) &&
     (pFVar1 = pParse->pNewTable->pFKey, pFVar1 != (FKey *)0x0)) {
    pFVar1->isDeferred = (u8)isDeferred;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeferForeignKey(Parse *pParse, int isDeferred){
#ifndef SQLITE_OMIT_FOREIGN_KEY
  Table *pTab;
  FKey *pFKey;
  if( (pTab = pParse->pNewTable)==0 || (pFKey = pTab->pFKey)==0 ) return;
  assert( isDeferred==0 || isDeferred==1 ); /* EV: R-30323-21917 */
  pFKey->isDeferred = (u8)isDeferred;
#endif
}